

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O1

Reals __thiscall Omega_h::resize_symms(Omega_h *this,Reals *old_symms,Int old_dim,Int new_dim)

{
  int *piVar1;
  undefined4 in_register_00000014;
  void *extraout_RDX;
  Alloc *pAVar3;
  bool bVar4;
  Reals RVar5;
  Reals local_30;
  Reals local_20;
  void *pvVar2;
  
  if (old_dim == new_dim) {
    pAVar3 = (old_symms->write_).shared_alloc_.alloc;
    *(Alloc **)this = pAVar3;
    *(void **)(this + 8) = (old_symms->write_).shared_alloc_.direct_ptr;
    bVar4 = ((ulong)pAVar3 & 7) != 0;
    pvVar2 = (void *)CONCAT71((int7)(CONCAT44(in_register_00000014,old_dim) >> 8),
                              bVar4 || pAVar3 == (Alloc *)0x0);
    if ((!bVar4 && pAVar3 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      pAVar3->use_count = pAVar3->use_count + -1;
      *(size_t *)this = pAVar3->size * 8 + 1;
    }
    (old_symms->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (old_symms->write_).shared_alloc_.direct_ptr = (void *)0x0;
  }
  else {
    if (new_dim == 3 && old_dim == 2) {
      local_20.write_.shared_alloc_.alloc = (old_symms->write_).shared_alloc_.alloc;
      if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
          local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_20.write_.shared_alloc_.alloc =
               (Alloc *)((local_20.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_20.write_.shared_alloc_.alloc)->use_count =
               (local_20.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_20.write_.shared_alloc_.direct_ptr = (old_symms->write_).shared_alloc_.direct_ptr;
      RVar5 = resize_symms_tmpl<2,3>(this,&local_20);
      pvVar2 = RVar5.write_.shared_alloc_.direct_ptr;
      pAVar3 = local_20.write_.shared_alloc_.alloc;
    }
    else {
      if ((old_dim != 3) || (new_dim != 2)) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
             ,0x26);
      }
      local_30.write_.shared_alloc_.alloc = (old_symms->write_).shared_alloc_.alloc;
      if (((ulong)local_30.write_.shared_alloc_.alloc & 7) == 0 &&
          local_30.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_30.write_.shared_alloc_.alloc =
               (Alloc *)((local_30.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_30.write_.shared_alloc_.alloc)->use_count =
               (local_30.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_30.write_.shared_alloc_.direct_ptr = (old_symms->write_).shared_alloc_.direct_ptr;
      RVar5 = resize_symms_tmpl<3,2>(this,&local_30);
      pvVar2 = RVar5.write_.shared_alloc_.direct_ptr;
      pAVar3 = local_30.write_.shared_alloc_.alloc;
    }
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
        pvVar2 = extraout_RDX;
      }
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals resize_symms(Reals old_symms, Int old_dim, Int new_dim) {
  if (old_dim == new_dim) return old_symms;
  if (old_dim == 2 && new_dim == 3) return resize_symms_tmpl<2, 3>(old_symms);
  if (old_dim == 3 && new_dim == 2) return resize_symms_tmpl<3, 2>(old_symms);
  OMEGA_H_NORETURN(Reals());
}